

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

void __thiscall
irr::video::CImage::CImage
          (CImage *this,ECOLOR_FORMAT format,dimension2d<unsigned_int> *size,void *data,
          bool ownForeignMemory,bool deleteMemory)

{
  undefined1 auVar1 [16];
  uint uVar2;
  u32 uVar3;
  ulong uVar4;
  void *pvVar5;
  void *in_RCX;
  dimension2d<unsigned_int> *in_RDX;
  ECOLOR_FORMAT in_ESI;
  void **in_RDI;
  uint in_R8D;
  u32 allocSize;
  u32 dataSize;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  uVar2 = in_R8D & 1;
  pvVar5 = in_RCX;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 7));
  IImage::IImage((IImage *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,
                 in_ESI,in_RDX,SUB81((ulong)pvVar5 >> 0x38,0));
  *in_RDI = vtable + 0x18;
  in_RDI[7] = vtable + 0x90;
  if (uVar2 == 0) {
    uVar3 = IImage::getDataSizeFromFormat((ECOLOR_FORMAT)((ulong)pvVar5 >> 0x20),(u32)pvVar5,in_R8D)
    ;
    auVar1 = ZEXT416((uVar3 + 0xf & 0xfffffff0) >> 2) * ZEXT816(4);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    in_RDI[3] = pvVar5;
    memcpy(in_RDI[3],in_RCX,(ulong)uVar3);
    *(undefined1 *)(in_RDI + 6) = 1;
  }
  else {
    in_RDI[3] = in_RCX;
  }
  return;
}

Assistant:

CImage::CImage(ECOLOR_FORMAT format, const core::dimension2d<u32> &size, void *data,
		bool ownForeignMemory, bool deleteMemory) :
		IImage(format, size, deleteMemory)
{
	if (ownForeignMemory) {
		Data = (u8 *)data;
	} else {
		const u32 dataSize = getDataSizeFromFormat(Format, Size.Width, Size.Height);
		const u32 allocSize = align_next(dataSize, 16);

		// allocate as u32 to ensure enough alignment when casted
		Data = reinterpret_cast<u8 *>(new u32[allocSize / 4]);
		memcpy(Data, data, dataSize);
		DeleteMemory = true;
	}
}